

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O1

expected<void,_std::error_code> * __thiscall
jaegertracing::anon_unknown_12::ReaderMock<opentracing::v3::HTTPHeadersReader>::ForeachKey
          (expected<void,_std::error_code> *__return_storage_ptr__,
          ReaderMock<opentracing::v3::HTTPHeadersReader> *this,
          function<opentracing::v3::expected<void,_std::error_code>_(opentracing::v3::string_view,_opentracing::v3::string_view)>
          *f)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  expected<void,_std::error_code> local_40;
  
  p_Var1 = (this->_keyValuePairs->_M_h)._M_before_begin._M_nxt;
  bVar2 = p_Var1 == (_Hash_node_base *)0x0;
  if (bVar2) {
    local_40.has_value_ = __return_storage_ptr__->has_value_;
LAB_00195265:
    __return_storage_ptr__->has_value_ = local_40.has_value_;
  }
  else {
    std::
    function<opentracing::v3::expected<void,_std::error_code>_(opentracing::v3::string_view,_opentracing::v3::string_view)>
    ::operator()(&local_40,f,*(string_view *)(p_Var1 + 1),*(string_view *)(p_Var1 + 5));
    if (local_40.has_value_ == true) {
      do {
        p_Var1 = p_Var1->_M_nxt;
        bVar2 = p_Var1 == (_Hash_node_base *)0x0;
        if (bVar2) goto LAB_00195265;
        std::
        function<opentracing::v3::expected<void,_std::error_code>_(opentracing::v3::string_view,_opentracing::v3::string_view)>
        ::operator()(&local_40,f,*(string_view *)(p_Var1 + 1),*(string_view *)(p_Var1 + 5));
      } while (local_40.has_value_ != false);
    }
    __return_storage_ptr__->has_value_ = local_40.has_value_;
    *(undefined8 *)&__return_storage_ptr__->contained = local_40.contained._0_8_;
    (__return_storage_ptr__->contained).m_error._M_cat = local_40.contained.m_error._M_cat;
    if (!bVar2) {
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->has_value_ = true;
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<void> ForeachKey(
        std::function<opentracing::expected<void>(opentracing::string_view,
                                                  opentracing::string_view)> f)
        const override
    {
        for (auto&& pair : _keyValuePairs) {
            const auto result = f(pair.first, pair.second);
            if (!result) {
                return result;
            }
        }
        return opentracing::make_expected();
    }